

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O0

int X509_EXTENSION_set_data(X509_EXTENSION *ex,ASN1_OCTET_STRING *data)

{
  int iVar1;
  int i;
  ASN1_OCTET_STRING *data_local;
  X509_EXTENSION *ex_local;
  
  if (ex == (X509_EXTENSION *)0x0) {
    ex_local._4_4_ = 0;
  }
  else {
    iVar1 = ASN1_OCTET_STRING_set(ex->value,data->data,data->length);
    if (iVar1 == 0) {
      ex_local._4_4_ = 0;
    }
    else {
      ex_local._4_4_ = 1;
    }
  }
  return ex_local._4_4_;
}

Assistant:

int X509_EXTENSION_set_data(X509_EXTENSION *ex, const ASN1_OCTET_STRING *data) {
  int i;

  if (ex == NULL) {
    return 0;
  }
  i = ASN1_OCTET_STRING_set(ex->value, data->data, data->length);
  if (!i) {
    return 0;
  }
  return 1;
}